

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm.cpp
# Opt level: O0

void __thiscall wasm::TableInit::finalize(TableInit *this)

{
  bool bVar1;
  bool local_31;
  Type local_30;
  BasicType local_24 [3];
  Type local_18;
  TableInit *local_10;
  TableInit *this_local;
  
  local_10 = this;
  wasm::Type::Type(&local_18,none);
  (this->super_SpecificExpression<(wasm::Expression::Id)51>).super_Expression.type.id = local_18.id;
  local_24[2] = 1;
  bVar1 = wasm::Type::operator==(&this->dest->type,local_24 + 2);
  local_31 = true;
  if (!bVar1) {
    local_24[1] = 1;
    bVar1 = wasm::Type::operator==(&this->offset->type,local_24 + 1);
    local_31 = true;
    if (!bVar1) {
      local_24[0] = unreachable;
      local_31 = wasm::Type::operator==(&this->size->type,local_24);
    }
  }
  if (local_31 != false) {
    wasm::Type::Type(&local_30,unreachable);
    (this->super_SpecificExpression<(wasm::Expression::Id)51>).super_Expression.type.id =
         local_30.id;
  }
  return;
}

Assistant:

void TableInit::finalize() {
  type = Type::none;
  if (dest->type == Type::unreachable || offset->type == Type::unreachable ||
      size->type == Type::unreachable) {
    type = Type::unreachable;
  }
}